

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::FramebufferBlitTests::init(FramebufferBlitTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 internalFormat;
  long lVar2;
  Context *pCVar3;
  bool bVar4;
  TextureChannelClass TVar5;
  TextureChannelClass TVar6;
  TestNode *pTVar8;
  long *plVar9;
  undefined8 *puVar10;
  BlitRectCase *pBVar11;
  long lVar12;
  TextureFormat TVar13;
  char *pcVar14;
  FboTestCase *pFVar15;
  BlitDepthStencilCase *pBVar16;
  undefined7 extraout_var;
  ulong *puVar17;
  size_type *psVar18;
  uint srcBuffers;
  long lVar19;
  ulong uVar20;
  EVP_PKEY_CTX *ctx_00;
  BlitArea BVar21;
  long lVar22;
  bool bVar23;
  IVec4 srcRect_1;
  ulong local_148;
  long lStack_140;
  IVec4 srcRect;
  ulong local_128;
  long lStack_120;
  IVec4 dstRect;
  ulong local_108;
  long lStack_100;
  string name;
  IVec2 dstSize;
  IVec2 srcSize;
  long local_a0 [2];
  BlitDepthStencilCase *local_90;
  TextureFormat local_88;
  uint local_7c;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  int iVar7;
  
  ctx_00 = (EVP_PKEY_CTX *)this;
  if (init()::copyRects == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  if (init()::filterConsistencyRects == '\0') {
    init(ctx_00);
  }
  if (init()::swizzles == '\0') {
    init(ctx_00);
  }
  srcSize.m_data[0] = 0x7f;
  srcSize.m_data[1] = 0x77;
  dstSize.m_data[0] = 0x84;
  dstSize.m_data[1] = 0x80;
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rect",
             "Blit rectangle tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar12 = 0;
  do {
    lVar19 = lVar12 * 0x28;
    lVar22 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcRect_1,init::copyRects[lVar12].name,(allocator<char> *)&dstRect);
      lVar2 = *(long *)((long)init::swizzles[0].srcSwizzle.m_data + lVar22 + -8);
      if (lVar2 == 0) {
        srcRect.m_data._0_8_ = &local_128;
        srcRect.m_data[2] = 0;
        srcRect.m_data[3] = 0;
        local_128 = local_128 & 0xffffffffffffff00;
      }
      else {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"_","");
        plVar9 = (long *)std::__cxx11::string::append((char *)local_58);
        srcRect.m_data._0_8_ = &local_128;
        puVar17 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar17) {
          local_128 = *puVar17;
          lStack_120 = plVar9[3];
        }
        else {
          local_128 = *puVar17;
          srcRect.m_data._0_8_ = (ulong *)*plVar9;
        }
        srcRect.m_data._8_8_ = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
      }
      uVar20 = 0xf;
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        uVar20 = local_148;
      }
      if (uVar20 < (ulong)(srcRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) {
        uVar20 = 0xf;
        if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
          uVar20 = local_128;
        }
        if (uVar20 < (ulong)(srcRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) goto LAB_012c33b6;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&srcRect,0,(char *)0x0,srcRect_1.m_data._0_8_);
      }
      else {
LAB_012c33b6:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&srcRect_1,srcRect.m_data._0_8_);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar18 = puVar10 + 2;
      if ((size_type *)*puVar10 == psVar18) {
        name.field_2._M_allocated_capacity = *psVar18;
        name.field_2._8_8_ = puVar10[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar18;
        name._M_dataplus._M_p = (pointer)*puVar10;
      }
      name._M_string_length = puVar10[1];
      *puVar10 = psVar18;
      puVar10[1] = 0;
      *(char *)psVar18 = '\0';
      if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
        operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
      }
      if ((lVar2 != 0) && (local_58[0] != local_48)) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
      srcRect.m_data[1] =
           *(int *)(lVar19 + 0x2262b68 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar22 + 4) * 4);
      srcRect.m_data[0] =
           *(int *)(lVar19 + 0x2262b68 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar22) * 4);
      srcRect.m_data[3] =
           *(int *)(lVar19 + 0x2262b68 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar22 + 0xc) * 4);
      srcRect.m_data[2] =
           *(int *)(lVar19 + 0x2262b68 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar22 + 8) * 4);
      dstRect.m_data[1] =
           *(int *)(lVar19 + 0x2262b78 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar22 + 4) * 4);
      dstRect.m_data[0] =
           *(int *)(lVar19 + 0x2262b78 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar22) * 4);
      dstRect.m_data[3] =
           *(int *)(lVar19 + 0x2262b78 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar22 + 0xc) * 4);
      dstRect.m_data[2] =
           *(int *)(lVar19 + 0x2262b78 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar22 + 8) * 4);
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      BlitRectCase::BlitRectCase
                (pBVar11,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 ::glcts::fixed_sample_locations_values + 1,0x2600,&srcSize,&srcRect,&dstSize,
                 &dstRect,8);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      BlitRectCase::BlitRectCase
                (pBVar11,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 ::glcts::fixed_sample_locations_values + 1,0x2601,&srcSize,&srcRect,&dstSize,
                 &dstRect,8);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar22 = lVar22 + 0x28;
    } while (lVar22 != 0x118);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  pBVar16 = (BlitDepthStencilCase *)0x0;
  do {
    lVar12 = (long)pBVar16 * 0x28;
    lVar19 = 0;
    local_90 = pBVar16;
    do {
      srcRect.m_data._0_8_ = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&srcRect,"nearest_consistency_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
      srcRect_1.m_data._0_8_ = &local_148;
      puVar17 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar17) {
        local_148 = *puVar17;
        lStack_140 = plVar9[3];
      }
      else {
        local_148 = *puVar17;
        srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
      }
      srcRect_1.m_data._8_8_ = plVar9[1];
      *plVar9 = (long)puVar17;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      lVar22 = *(long *)((long)init::swizzles[0].srcSwizzle.m_data + lVar19 + -8);
      if (lVar22 == 0) {
        dstRect.m_data[2] = 0;
        dstRect.m_data[3] = 0;
        local_108 = local_108 & 0xffffffffffffff00;
        dstRect.m_data._0_8_ = &local_108;
      }
      else {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"_","");
        plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
        puVar17 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar17) {
          local_108 = *puVar17;
          lStack_100 = plVar9[3];
          dstRect.m_data._0_8_ = &local_108;
        }
        else {
          local_108 = *puVar17;
          dstRect.m_data._0_8_ = (ulong *)*plVar9;
        }
        dstRect.m_data._8_8_ = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
      }
      uVar20 = 0xf;
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        uVar20 = local_148;
      }
      if (uVar20 < (ulong)(dstRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) {
        uVar20 = 0xf;
        if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
          uVar20 = local_108;
        }
        if (uVar20 < (ulong)(dstRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) goto LAB_012c3835;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&dstRect,0,(char *)0x0,srcRect_1.m_data._0_8_);
      }
      else {
LAB_012c3835:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&srcRect_1,dstRect.m_data._0_8_);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar18 = puVar10 + 2;
      if ((size_type *)*puVar10 == psVar18) {
        name.field_2._M_allocated_capacity = *psVar18;
        name.field_2._8_8_ = puVar10[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar18;
        name._M_dataplus._M_p = (pointer)*puVar10;
      }
      name._M_string_length = puVar10[1];
      *puVar10 = psVar18;
      puVar10[1] = 0;
      *(char *)psVar18 = '\0';
      if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
        operator_delete((void *)dstRect.m_data._0_8_,local_108 + 1);
      }
      if ((lVar22 != 0) && (local_78[0] != local_68)) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
      if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
        operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
      }
      srcRect_1.m_data[1] =
           *(int *)(lVar12 + 0x2262be8 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar19 + 4) * 4);
      srcRect_1.m_data[0] =
           *(int *)(lVar12 + 0x2262be8 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar19) * 4);
      srcRect_1.m_data[3] =
           *(int *)(lVar12 + 0x2262be8 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar19 + 0xc) * 4);
      srcRect_1.m_data[2] =
           *(int *)(lVar12 + 0x2262be8 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar19 + 8) * 4);
      srcRect.m_data[1] =
           *(int *)(lVar12 + 0x2262bf8 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar19 + 4) * 4);
      srcRect.m_data[0] =
           *(int *)(lVar12 + 0x2262bf8 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar19) * 4);
      srcRect.m_data[3] =
           *(int *)(lVar12 + 0x2262bf8 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar19 + 0xc) * 4);
      srcRect.m_data[2] =
           *(int *)(lVar12 + 0x2262bf8 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar19 + 8) * 4);
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      BlitRectCase::BlitRectCase
                (pBVar11,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 "Test consistency of the nearest filter",0x2600,&srcSize,&srcRect_1,&dstSize,
                 &srcRect,1);
      (pBVar11->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_021554e0;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0x118);
    pBVar16 = (BlitDepthStencilCase *)
              ((long)&(local_90->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      _vptr_TestNode + 1);
  } while (pBVar16 != (BlitDepthStencilCase *)&DAT_00000004);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Color conversion tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar12 = 0;
  do {
    dVar1 = init::colorFormats[lVar12];
    lVar19 = 0;
    do {
      TVar13 = glu::mapGLInternalFormat(dVar1);
      TVar5 = tcu::getTextureChannelClass(TVar13.type);
      internalFormat = *(deUint32 *)((long)init::colorFormats + lVar19);
      TVar13 = glu::mapGLInternalFormat(internalFormat);
      TVar6 = tcu::getTextureChannelClass(TVar13.type);
      if ((((TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
            TVar5 == TEXTURECHANNELCLASS_FLOATING_POINT) !=
            (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
            TVar6 != TEXTURECHANNELCLASS_FLOATING_POINT)) &&
          ((TVar5 == TEXTURECHANNELCLASS_SIGNED_INTEGER) !=
           (TVar6 != TEXTURECHANNELCLASS_SIGNED_INTEGER))) &&
         ((TVar5 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) !=
          (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER))) {
        pcVar14 = FboTestUtil::getFormatName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcRect,pcVar14,(allocator<char> *)&dstRect);
        plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
        srcRect_1.m_data._0_8_ = &local_148;
        puVar17 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar17) {
          local_148 = *puVar17;
          lStack_140 = plVar9[3];
        }
        else {
          local_148 = *puVar17;
          srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
        }
        srcRect_1.m_data._8_8_ = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        FboTestUtil::getFormatName(internalFormat);
        plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect_1);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar18 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar18) {
          name.field_2._M_allocated_capacity = *psVar18;
          name.field_2._8_8_ = plVar9[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar18;
          name._M_dataplus._M_p = (pointer)*plVar9;
        }
        name._M_string_length = plVar9[1];
        *plVar9 = (long)psVar18;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
          operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
        }
        if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
          operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
        }
        pFVar15 = (FboTestCase *)operator_new(0x98);
        FboTestCase::FboTestCase
                  (pFVar15,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   ::glcts::fixed_sample_locations_values + 1,false);
        (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__FboTestCase_02155628;
        *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1
        ;
        *(deUint32 *)
         ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             internalFormat;
        pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
             (TestContext *)0x710000007f;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0x8c);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x23);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_stencil","Depth and stencil blits");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar12 = 0;
  do {
    dVar1 = *(deUint32 *)((long)init::depthStencilFormats + lVar12);
    local_38 = lVar12;
    TVar13 = glu::mapGLInternalFormat(dVar1);
    pcVar14 = FboTestUtil::getFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar14,(allocator<char> *)&srcRect_1);
    local_7c = TVar13.order - S;
    bVar23 = local_7c < 2;
    local_88 = TVar13;
    local_90 = (BlitDepthStencilCase *)operator_new(200);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    srcRect_1.m_data._0_8_ = &local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&srcRect_1,name._M_dataplus._M_p,
               name._M_dataplus._M_p + name._M_string_length);
    std::__cxx11::string::append((char *)&srcRect_1);
    pBVar16 = local_90;
    srcBuffers = (uint)bVar23 << 10 | (uint)((TVar13.order - D & 0xfffffffd) == 0) << 8;
    srcSize.m_data[0] = 0x80;
    srcSize.m_data[1] = 0x80;
    srcRect.m_data[0] = 0;
    srcRect.m_data[1] = 0;
    srcRect.m_data[2] = 0x80;
    srcRect.m_data[3] = 0x80;
    dstSize.m_data[0] = 0x80;
    dstSize.m_data[1] = 0x80;
    dstRect.m_data[0] = 0;
    dstRect.m_data[1] = 0;
    dstRect.m_data[2] = 0x80;
    dstRect.m_data[3] = 0x80;
    BlitDepthStencilCase::BlitDepthStencilCase
              (local_90,pCVar3,(char *)srcRect_1.m_data._0_8_,
               ::glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
               srcBuffers,&dstSize,&dstRect,srcBuffers);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar16);
    if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
      operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
    }
    pBVar16 = (BlitDepthStencilCase *)operator_new(200);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    srcRect_1.m_data._0_8_ = &local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&srcRect_1,name._M_dataplus._M_p,
               name._M_dataplus._M_p + name._M_string_length);
    std::__cxx11::string::append((char *)&srcRect_1);
    srcSize.m_data[0] = 0x7f;
    srcSize.m_data[1] = 0x77;
    srcRect.m_data[0] = 10;
    srcRect.m_data[1] = 0x1e;
    srcRect.m_data[2] = 100;
    srcRect.m_data[3] = 0x46;
    dstSize.m_data[0] = 0x6f;
    dstSize.m_data[1] = 0x82;
    dstRect.m_data[0] = 0x14;
    dstRect.m_data[1] = 5;
    dstRect.m_data[2] = 0x50;
    dstRect.m_data[3] = 0x82;
    BlitDepthStencilCase::BlitDepthStencilCase
              (pBVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
               ::glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
               srcBuffers,&dstSize,&dstRect,srcBuffers);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar16);
    if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
      operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
    }
    if (((local_88.order == DS) || (local_88.order == D)) && (local_7c < 2)) {
      pBVar16 = (BlitDepthStencilCase *)operator_new(200);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      srcSize.m_data[0] = 0x80;
      srcSize.m_data[1] = 0x80;
      srcRect.m_data[0] = 0;
      srcRect.m_data[1] = 0;
      srcRect.m_data[2] = 0x80;
      srcRect.m_data[3] = 0x80;
      dstSize.m_data[0] = 0x80;
      dstSize.m_data[1] = 0x80;
      dstRect.m_data[0] = 0;
      dstRect.m_data[1] = 0;
      dstRect.m_data[2] = 0x80;
      dstRect.m_data[3] = 0x80;
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 ::glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                 srcBuffers,&dstSize,&dstRect,0x100);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar16);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
      pBVar16 = (BlitDepthStencilCase *)operator_new(200);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      srcSize.m_data[0] = 0x80;
      srcSize.m_data[1] = 0x80;
      srcRect.m_data[0] = 0;
      srcRect.m_data[1] = 0;
      srcRect.m_data[2] = 0x80;
      srcRect.m_data[3] = 0x80;
      dstSize.m_data[0] = 0x80;
      dstSize.m_data[1] = 0x80;
      dstRect.m_data[0] = 0;
      dstRect.m_data[1] = 0;
      dstRect.m_data[2] = 0x80;
      dstRect.m_data[3] = 0x80;
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 ::glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                 srcBuffers,&dstSize,&dstRect,0x400);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar16);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar12 = local_38 + 4;
  } while (lVar12 != 0x18);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "default_framebuffer","Blits with default framebuffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  local_88 = (TextureFormat)0x0;
  do {
    dVar1 = init::colorFormats[(long)local_88];
    TVar13 = glu::mapGLInternalFormat(dVar1);
    TVar5 = tcu::getTextureChannelClass(TVar13.type);
    bVar23 = glu::isGLInternalColorFormatFilterable(dVar1);
    bVar4 = glu::isGLInternalColorFormatFilterable(dVar1);
    iVar7 = (int)CONCAT71(extraout_var,bVar4);
    local_90 = (BlitDepthStencilCase *)CONCAT71(local_90._1_7_,bVar4);
    if ((TVar5 < TEXTURECHANNELCLASS_LAST) && (iVar7 = 0x13, (0x13U >> (TVar5 & 0x1f) & 1) != 0)) {
      pFVar15 = (FboTestCase *)operator_new(0x90);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar14 = FboTestUtil::getFormatName(dVar1);
      FboTestCase::FboTestCase
                (pFVar15,pCVar3,pcVar14,::glcts::fixed_sample_locations_values + 1,false);
      (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_021556f8;
      *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(uint *)((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           bVar23 | 0x2600;
      tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
      lVar12 = 0;
      bVar23 = true;
      do {
        bVar4 = bVar23;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,init::areas[lVar12].name,(allocator<char> *)&srcRect_1);
        if (((char)local_90 == '\0') ||
           (BVar21 = AREA_OUT_OF_BOUNDS, init::areas[lVar12].area != AREA_OUT_OF_BOUNDS)) {
          pFVar15 = (FboTestCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar14 = FboTestUtil::getFormatName(dVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcSize,pcVar14,(allocator<char> *)&dstSize);
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcSize);
          dstRect.m_data._0_8_ = &local_108;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_108 = *puVar17;
            lStack_100 = plVar9[3];
          }
          else {
            local_108 = *puVar17;
            dstRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          dstRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
          srcRect.m_data._0_8_ = &local_128;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_128 = *puVar17;
            lStack_120 = plVar9[3];
          }
          else {
            local_128 = *puVar17;
            srcRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
          srcRect_1.m_data._0_8_ = &local_148;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_148 = *puVar17;
            lStack_140 = plVar9[3];
          }
          else {
            local_148 = *puVar17;
            srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect_1.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          BVar21 = init::areas[lVar12].area;
          FboTestCase::FboTestCase
                    (pFVar15,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     ::glcts::fixed_sample_locations_values + 1,false);
          *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar1;
          *(undefined8 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               0x2600;
          (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__FboTestCase_02155760;
          *(BlitArea *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = BVar21;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
           4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length +
           4) = 0xffffffff;
          *(undefined4 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
               0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                   ._M_p + 4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                   _M_string_length + 4) = 0xffffffff;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
          }
          if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
            operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
          }
          if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
            operator_delete((void *)dstRect.m_data._0_8_,local_108 + 1);
          }
          if (srcSize.m_data != (int  [2])local_a0) {
            operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
          }
          pFVar15 = (FboTestCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar14 = FboTestUtil::getFormatName(dVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcSize,pcVar14,(allocator<char> *)&dstSize);
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcSize);
          dstRect.m_data._0_8_ = &local_108;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_108 = *puVar17;
            lStack_100 = plVar9[3];
          }
          else {
            local_108 = *puVar17;
            dstRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          dstRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
          srcRect.m_data._0_8_ = &local_128;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_128 = *puVar17;
            lStack_120 = plVar9[3];
          }
          else {
            local_128 = *puVar17;
            srcRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
          srcRect_1.m_data._0_8_ = &local_148;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_148 = *puVar17;
            lStack_140 = plVar9[3];
          }
          else {
            local_148 = *puVar17;
            srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect_1.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          FboTestCase::FboTestCase
                    (pFVar15,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     ::glcts::fixed_sample_locations_values + 1,false);
          *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar1;
          *(undefined8 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               0x100002600;
          (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__FboTestCase_02155760;
          *(BlitArea *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = BVar21;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
           4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length +
           4) = 0xffffffff;
          *(undefined4 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
               0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                   ._M_p + 4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                   _M_string_length + 4) = 0xffffffff;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
          }
          if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
            operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
          }
          if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
            operator_delete((void *)dstRect.m_data._0_8_,local_108 + 1);
          }
          if (srcSize.m_data != (int  [2])local_a0) {
            operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
          }
          if ((char)local_90 != '\0') goto LAB_012c4750;
        }
        else {
LAB_012c4750:
          pFVar15 = (FboTestCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar14 = FboTestUtil::getFormatName(dVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcSize,pcVar14,(allocator<char> *)&dstSize);
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcSize);
          dstRect.m_data._0_8_ = &local_108;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_108 = *puVar17;
            lStack_100 = plVar9[3];
          }
          else {
            local_108 = *puVar17;
            dstRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          dstRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
          srcRect.m_data._0_8_ = &local_128;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_128 = *puVar17;
            lStack_120 = plVar9[3];
          }
          else {
            local_128 = *puVar17;
            srcRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
          srcRect_1.m_data._0_8_ = &local_148;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_148 = *puVar17;
            lStack_140 = plVar9[3];
          }
          else {
            local_148 = *puVar17;
            srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect_1.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          FboTestCase::FboTestCase
                    (pFVar15,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     ::glcts::fixed_sample_locations_values + 1,false);
          *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar1;
          *(undefined8 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               0x2601;
          (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__FboTestCase_02155760;
          *(BlitArea *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = BVar21;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
           4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length +
           4) = 0xffffffff;
          *(undefined4 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
               0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                   ._M_p + 4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                   _M_string_length + 4) = 0xffffffff;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
          }
          if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
            operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
          }
          if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
            operator_delete((void *)dstRect.m_data._0_8_,local_108 + 1);
          }
          if (srcSize.m_data != (int  [2])local_a0) {
            operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
          }
          pFVar15 = (FboTestCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar14 = FboTestUtil::getFormatName(dVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcSize,pcVar14,(allocator<char> *)&dstSize);
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcSize);
          dstRect.m_data._0_8_ = &local_108;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_108 = *puVar17;
            lStack_100 = plVar9[3];
          }
          else {
            local_108 = *puVar17;
            dstRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          dstRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
          srcRect.m_data._0_8_ = &local_128;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_128 = *puVar17;
            lStack_120 = plVar9[3];
          }
          else {
            local_128 = *puVar17;
            srcRect.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&srcRect);
          srcRect_1.m_data._0_8_ = &local_148;
          puVar17 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar17) {
            local_148 = *puVar17;
            lStack_140 = plVar9[3];
          }
          else {
            local_148 = *puVar17;
            srcRect_1.m_data._0_8_ = (ulong *)*plVar9;
          }
          srcRect_1.m_data._8_8_ = plVar9[1];
          *plVar9 = (long)puVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          FboTestCase::FboTestCase
                    (pFVar15,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     ::glcts::fixed_sample_locations_values + 1,false);
          *(deUint32 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar1;
          *(undefined8 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               0x100002601;
          (pFVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__FboTestCase_02155760;
          *(BlitArea *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = BVar21;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
           4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length +
           4) = 0xffffffff;
          *(undefined4 *)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
               0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                   ._M_p + 4) = 0xffffffff;
          *(undefined4 *)
           &pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length =
               0xffffffff;
          *(undefined4 *)
           ((long)&pFVar15[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                   _M_string_length + 4) = 0xffffffff;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pFVar15);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_148) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_148 + 1);
          }
          if ((ulong *)srcRect.m_data._0_8_ != &local_128) {
            operator_delete((void *)srcRect.m_data._0_8_,local_128 + 1);
          }
          if ((ulong *)dstRect.m_data._0_8_ != &local_108) {
            operator_delete((void *)dstRect.m_data._0_8_,local_108 + 1);
          }
          if (srcSize.m_data != (int  [2])local_a0) {
            operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar12 = 1;
        iVar7 = 0;
        bVar23 = false;
      } while (bVar4);
    }
    local_88 = (TextureFormat)((long)local_88 + 1);
    if (local_88 == (TextureFormat)0x23) {
      return iVar7;
    }
  } while( true );
}

Assistant:

void FramebufferBlitTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .rect
	{
		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} copyRects[] =
		{
			{ "basic",						IVec4( 10,  20,  65, 100),		IVec4( 45,   5, 100,  85) },
			{ "scale",						IVec4( 10,  20,  65, 100),		IVec4( 25,  30, 125,  94) },
			{ "out_of_bounds",				IVec4(-10, -15, 100,  63),		IVec4( 50,  30, 136, 144) },
		};

		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} filterConsistencyRects[] =
		{
			{ "mag",						IVec4( 20,  10,  74, 88),		IVec4( 10,  10,  91, 101) },
			{ "min",						IVec4( 10,  20,  78, 100),		IVec4( 20,  20,  71,  80) },
			{ "out_of_bounds_mag",			IVec4( 21,  10,  73, 82),		IVec4( 11,  43, 141, 151) },
			{ "out_of_bounds_min",			IVec4( 11,  21,  77, 97),		IVec4( 80,  82, 135, 139) },
		};

		static const struct
		{
			const char* name;
			IVec4		srcSwizzle;
			IVec4		dstSwizzle;
		} swizzles[] =
		{
			{ DE_NULL,				IVec4(0,1,2,3),	IVec4(0,1,2,3) },
			{ "reverse_src_x",		IVec4(2,1,0,3), IVec4(0,1,2,3) },
			{ "reverse_src_y",		IVec4(0,3,2,1), IVec4(0,1,2,3) },
			{ "reverse_dst_x",		IVec4(0,1,2,3), IVec4(2,1,0,3) },
			{ "reverse_dst_y",		IVec4(0,1,2,3), IVec4(0,3,2,1) },
			{ "reverse_src_dst_x",	IVec4(2,1,0,3), IVec4(2,1,0,3) },
			{ "reverse_src_dst_y",	IVec4(0,3,2,1), IVec4(0,3,2,1) }
		};

		const IVec2 srcSize(127, 119);
		const IVec2 dstSize(132, 128);

		// Blit rectangle tests.
		tcu::TestCaseGroup* rectGroup = new tcu::TestCaseGroup(m_testCtx, "rect", "Blit rectangle tests");
		addChild(rectGroup);
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(copyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string(copyRects[rectNdx].name) + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= copyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= copyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitRectCase(m_context, (name + "_nearest").c_str(),	"", GL_NEAREST,	srcSize, srcRect, dstSize, dstRect));
				rectGroup->addChild(new BlitRectCase(m_context, (name + "_linear").c_str(),		"", GL_LINEAR,	srcSize, srcRect, dstSize, dstRect));
			}
		}

		// Nearest filter tests
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(filterConsistencyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string("nearest_consistency_") + filterConsistencyRects[rectNdx].name + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= filterConsistencyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= filterConsistencyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitNearestFilterConsistencyCase(m_context, name.c_str(), "Test consistency of the nearest filter", srcSize, srcRect, dstSize, dstRect));
			}
		}
	}

	// .conversion
	{
		tcu::TestCaseGroup* conversionGroup = new tcu::TestCaseGroup(m_testCtx, "conversion", "Color conversion tests");
		addChild(conversionGroup);

		for (int srcFmtNdx = 0; srcFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); srcFmtNdx++)
		{
			for (int dstFmtNdx = 0; dstFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); dstFmtNdx++)
			{
				deUint32					srcFormat	= colorFormats[srcFmtNdx];
				tcu::TextureFormat			srcTexFmt	= glu::mapGLInternalFormat(srcFormat);
				tcu::TextureChannelClass	srcType		= tcu::getTextureChannelClass(srcTexFmt.type);
				deUint32					dstFormat	= colorFormats[dstFmtNdx];
				tcu::TextureFormat			dstTexFmt	= glu::mapGLInternalFormat(dstFormat);
				tcu::TextureChannelClass	dstType		= tcu::getTextureChannelClass(dstTexFmt.type);

				if (((srcType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) !=
					 (dstType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)))
					continue; // Conversion not supported.

				string						name		= string(getFormatName(srcFormat)) + "_to_" + getFormatName(dstFormat);

				conversionGroup->addChild(new BlitColorConversionCase(m_context, name.c_str(), "", srcFormat, dstFormat, IVec2(127, 113)));
			}
		}
	}

	// .depth_stencil
	{
		tcu::TestCaseGroup* depthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "depth_stencil", "Depth and stencil blits");
		addChild(depthStencilGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
		{
			deUint32			format		= depthStencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);
			string				fmtName		= getFormatName(format);
			bool				depth		= texFmt.order == tcu::TextureFormat::D || texFmt.order == tcu::TextureFormat::DS;
			bool				stencil		= texFmt.order == tcu::TextureFormat::S || texFmt.order == tcu::TextureFormat::DS;
			deUint32			buffers		= (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0);

			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_basic").c_str(), "", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers));
			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_scale").c_str(), "", format, buffers, IVec2(127, 119), IVec4(10, 30, 100, 70), buffers, IVec2(111, 130), IVec4(20, 5, 80, 130), buffers));

			if (depth && stencil)
			{
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_depth_only").c_str(),		"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_DEPTH_BUFFER_BIT));
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_stencil_only").c_str(),	"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_STENCIL_BUFFER_BIT));
			}
		}
	}

	// .default_framebuffer
	{
		static const struct
		{
			const char*								name;
			DefaultFramebufferBlitCase::BlitArea	area;
		} areas[] =
		{
			{ "scale",						DefaultFramebufferBlitCase::AREA_SCALE			},
			{ "out_of_bounds",				DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS	},
		};

		tcu::TestCaseGroup* defaultFbGroup = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Blits with default framebuffer");
		addChild(defaultFbGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			const deUint32					format		= colorFormats[fmtNdx];
			const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(format);
			const tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			const deUint32					filter		= glu::isGLInternalColorFormatFilterable(format) ? GL_LINEAR : GL_NEAREST;
			const bool						filterable	= glu::isGLInternalColorFormatFilterable(format);

			if (fmtClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				continue; // Conversion not supported.

			defaultFbGroup->addChild(new BlitDefaultFramebufferCase(m_context, getFormatName(format), "", format, filter));

			for (int areaNdx = 0; areaNdx < DE_LENGTH_OF_ARRAY(areas); areaNdx++)
			{
				const string	name				= string(areas[areaNdx].name);
				const bool		addLinear			= filterable;
				const bool		addNearest			= !addLinear || (areas[areaNdx].area != DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS); // No need to check out-of-bounds with different filtering

				if (addNearest)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_from_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_to_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}

				if (addLinear)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_from_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_to_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}
			}
		}
	}
}